

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_create_type.cpp
# Opt level: O0

SourceResultType __thiscall
duckdb::PhysicalCreateType::GetData
          (PhysicalCreateType *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  ulong uVar1;
  Catalog *this_00;
  ClientContext *in_RCX;
  long *in_RDI;
  Catalog *catalog;
  CreateTypeGlobalState *g_sink_state;
  LogicalType *in_stack_ffffffffffffff78;
  GlobalSinkState *in_stack_ffffffffffffff80;
  Vector *in_stack_ffffffffffffff88;
  CreateTypeInfo *in_stack_ffffffffffffffc8;
  ClientContext *in_stack_ffffffffffffffd0;
  CreateTypeGlobalState *in_stack_ffffffffffffffd8;
  
  uVar1 = (**(code **)(*in_RDI + 0x108))();
  if ((uVar1 & 1) != 0) {
    unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
    operator->((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                *)in_stack_ffffffffffffff80);
    in_stack_ffffffffffffffd8 =
         GlobalSinkState::Cast<duckdb::CreateTypeGlobalState>(in_stack_ffffffffffffff80);
    LogicalType::ENUM(in_stack_ffffffffffffff88,(idx_t)in_stack_ffffffffffffff80);
    unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
    operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                *)in_stack_ffffffffffffff80);
    LogicalType::operator=((LogicalType *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    LogicalType::~LogicalType((LogicalType *)0x18bd17a);
  }
  unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::operator->
            ((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
              *)in_stack_ffffffffffffff80);
  this_00 = Catalog::GetCatalog(in_RCX,(string *)in_stack_ffffffffffffffd8);
  unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::operator*
            ((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
              *)this_00);
  Catalog::CreateType((Catalog *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                      in_stack_ffffffffffffffc8);
  return FINISHED;
}

Assistant:

SourceResultType PhysicalCreateType::GetData(ExecutionContext &context, DataChunk &chunk,
                                             OperatorSourceInput &input) const {
	if (IsSink()) {
		D_ASSERT(info->type == LogicalType::INVALID);
		auto &g_sink_state = sink_state->Cast<CreateTypeGlobalState>();
		info->type = LogicalType::ENUM(g_sink_state.result, g_sink_state.size);
	}

	auto &catalog = Catalog::GetCatalog(context.client, info->catalog);
	catalog.CreateType(context.client, *info);
	return SourceResultType::FINISHED;
}